

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

void config_array_destroy(config_array *array)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = array->length;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (array->values[uVar2] != (config_value *)0x0) {
        config_value_destroy(array->values[uVar2]);
        uVar1 = array->length;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  free(array->values);
  free(array);
  return;
}

Assistant:

void config_array_destroy(struct config_array *array)
{
        for (size_t i = 0; i < array->length; ++i) {
                struct config_value *value_to_destroy = array->values[i];

                if (value_to_destroy != NULL) {
                        config_value_destroy(value_to_destroy);
                }
        }

        free(array->values);
        free(array);
}